

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  long lVar11;
  BrotliDictionary *pBVar12;
  size_t sVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  size_t *psVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  undefined8 uVar25;
  void *pvVar26;
  byte bVar27;
  size_t sVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  char *pcVar33;
  ushort uVar34;
  uint uVar35;
  ulong uVar36;
  uint8_t *puVar37;
  int *piVar38;
  uint uVar39;
  ulong uVar40;
  uint8_t *puVar41;
  ulong uVar42;
  long lVar43;
  size_t *psVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  size_t i;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  ulong local_170;
  ulong local_168;
  ulong local_150;
  ulong local_110;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_c8;
  size_t *local_c0;
  ulong local_b0;
  
  bVar27 = literal_context_lut[8];
  lVar11 = *(long *)(literal_context_lut + 0x10);
  uVar4 = (position - 3) + num_bytes;
  sVar28 = position;
  if (3 < num_bytes) {
    sVar28 = uVar4;
  }
  lVar29 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar29 = 0x40;
  }
  uVar45 = *(ulong *)dist_cache;
  uVar1 = position + num_bytes;
  uVar18 = (params->dist).alphabet_size_limit;
  if (4 < (int)uVar18) {
    iVar19 = *(int *)&(hasher->common).extra;
    *(int *)&(hasher->common).dict_num_matches = iVar19 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar19 + 1;
    (hasher->common).params.type = iVar19 + -2;
    (hasher->common).params.bucket_bits = iVar19 + 2;
    (hasher->common).params.block_bits = iVar19 + -3;
    (hasher->common).params.hash_len = iVar19 + 3;
    if (10 < uVar18) {
      iVar19 = *(int *)((long)&(hasher->common).extra + 4);
      (hasher->common).params.num_last_distances_to_check = iVar19 + -1;
      (hasher->common).is_prepared_ = iVar19 + 1;
      *(int *)&hasher->privat = iVar19 + -2;
      *(int *)((long)&hasher->privat + 4) = iVar19 + 2;
      (hasher->privat)._H5.block_size_ = CONCAT44(iVar19 + 3,iVar19 + -3);
    }
  }
  if (uVar1 <= position + 4) {
    local_c0 = last_insert_len;
LAB_00105ee6:
    *(ulong *)dist_cache = (uVar45 + uVar1) - position;
    *(long *)commands = *(long *)commands + ((long)local_c0 - (long)last_insert_len >> 4);
    return;
  }
  uVar5 = (1L << (bVar27 & 0x3f)) - 0x10;
  local_f8 = lVar29 + position;
  lVar3 = position - 1;
  local_c0 = last_insert_len;
  auVar57 = _DAT_0013b100;
LAB_0010430d:
  uVar52 = uVar1 - position;
  uVar30 = uVar5;
  if (position < uVar5) {
    uVar30 = position;
  }
  local_c8 = lVar11 + position;
  if (uVar5 <= lVar11 + position) {
    local_c8 = uVar5;
  }
  uVar22 = *(ulong *)(literal_context_lut + 0x50);
  pBVar12 = (params->dictionary).words;
  lVar43 = *(long *)&(params->dictionary).num_transforms;
  uVar40 = position & ringbuffer_mask;
  psVar44 = *(size_t **)backward_references;
  if (back_refs_position <= psVar44) {
    bVar56 = false;
    bVar15 = back_refs_position == (size_t *)0x0;
LAB_00104497:
    uVar36 = (ulong)(int)(params->dist).alphabet_size_limit;
    if (uVar36 == 0) {
      local_150 = 0x7e4;
      local_110 = 0;
      local_100 = 0;
      uVar48 = 0;
    }
    else {
      puVar41 = ringbuffer + uVar40;
      uVar47 = (ulong)((uint)uVar52 & 7);
      local_150 = 0x7e4;
      uVar48 = 0;
      uVar50 = 0;
      local_100 = 0;
      local_110 = 0;
      do {
        uVar42 = (ulong)*(int *)((long)&(hasher->common).extra + uVar50 * 4);
        if (((uVar42 <= uVar30) && (position - uVar42 < position)) &&
           (uVar48 + uVar40 <= ringbuffer_mask)) {
          uVar23 = position - uVar42 & ringbuffer_mask;
          if ((uVar23 + uVar48 <= ringbuffer_mask) &&
             (ringbuffer[uVar48 + uVar40] == ringbuffer[uVar23 + uVar48])) {
            if (7 < uVar52) {
              lVar24 = 0;
              uVar32 = 0;
LAB_00104587:
              if (*(ulong *)(puVar41 + uVar32 * 8) == *(ulong *)(ringbuffer + uVar32 * 8 + uVar23))
              goto code_r0x00104599;
              uVar32 = *(ulong *)(ringbuffer + uVar32 * 8 + uVar23) ^
                       *(ulong *)(puVar41 + uVar32 * 8);
              uVar23 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar32 = (uVar23 >> 3 & 0x1fffffff) - lVar24;
              goto LAB_001045da;
            }
            puVar37 = puVar41;
            uVar49 = 0;
LAB_00104688:
            uVar32 = uVar49;
            if (uVar47 != 0) {
              uVar31 = uVar47 | uVar49;
              uVar53 = uVar47;
              do {
                uVar32 = uVar49;
                if (ringbuffer[uVar49 + uVar23] != *puVar37) break;
                puVar37 = puVar37 + 1;
                uVar49 = uVar49 + 1;
                uVar53 = uVar53 - 1;
                uVar32 = uVar31;
              } while (uVar53 != 0);
            }
LAB_001045da:
            if ((bVar56) && ((ulong)(long)(int)num_literals[(long)psVar44 * 2] < uVar32 + position))
            {
              uVar32 = (long)(int)num_literals[(long)psVar44 * 2] - position;
            }
            if (((2 < uVar32) || ((uVar50 < 2 && (uVar32 == 2)))) &&
               (uVar23 = uVar32 * 0x87 + 0x78f, local_150 < uVar23)) {
              if (uVar50 != 0) {
                uVar23 = uVar23 - ((0x1ca10U >> ((byte)uVar50 & 0xe) & 0xe) + 0x27);
              }
              if (local_150 < uVar23) {
                uVar48 = uVar32;
                local_150 = uVar23;
                local_110 = uVar42;
                local_100 = uVar32;
              }
            }
          }
        }
        uVar50 = uVar50 + 1;
      } while (uVar50 != uVar36);
    }
    uVar18 = (uint)(*(int *)(ringbuffer + uVar40) * 0x1e35a7bd) >>
             ((byte)(params->dist).distance_postfix_bits & 0x1f);
    piVar2 = (int *)(ringbuffer + uVar40);
    lVar43 = lVar43 + (ulong)(uVar18 << ((byte)(params->dist).alphabet_size_max & 0x1f)) * 4;
    uVar6 = *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar18 * 2);
    uVar47 = (ulong)uVar6;
    piVar38 = &(params->hasher).num_last_distances_to_check;
    uVar36 = 0;
    if (*(ulong *)piVar38 <= uVar47) {
      uVar36 = uVar47 - *(long *)piVar38;
    }
    uVar35 = (params->dist).num_direct_distance_codes;
    if (uVar36 < uVar47) {
      uVar50 = (ulong)((uint)uVar52 & 7);
      do {
        uVar47 = uVar47 - 1;
        uVar39 = *(uint *)(lVar43 + (ulong)((uint)uVar47 & uVar35) * 4);
        uVar42 = position - uVar39;
        if (uVar30 < uVar42) break;
        if (uVar48 + uVar40 <= ringbuffer_mask) {
          uVar23 = (ulong)(uVar39 & (uint)ringbuffer_mask);
          if ((uVar23 + uVar48 <= ringbuffer_mask) &&
             (ringbuffer[uVar48 + uVar40] == ringbuffer[uVar23 + uVar48])) {
            if (7 < uVar52) {
              lVar24 = 0;
              uVar32 = 0;
LAB_001047e5:
              if (*(ulong *)(piVar2 + uVar32 * 2) == *(ulong *)(ringbuffer + uVar32 * 8 + uVar23))
              goto code_r0x001047f7;
              uVar32 = *(ulong *)(ringbuffer + uVar32 * 8 + uVar23) ^
                       *(ulong *)(piVar2 + uVar32 * 2);
              uVar23 = 0;
              if (uVar32 != 0) {
                for (; (uVar32 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar32 = (uVar23 >> 3 & 0x1fffffff) - lVar24;
              goto LAB_00104839;
            }
            piVar38 = piVar2;
            uVar49 = 0;
LAB_001048b3:
            uVar32 = uVar49;
            if (uVar50 != 0) {
              uVar31 = uVar50 | uVar49;
              uVar53 = uVar50;
              do {
                uVar32 = uVar49;
                if (ringbuffer[uVar49 + uVar23] != (uint8_t)*piVar38) break;
                piVar38 = (int *)((long)piVar38 + 1);
                uVar49 = uVar49 + 1;
                uVar53 = uVar53 - 1;
                uVar32 = uVar31;
              } while (uVar53 != 0);
            }
LAB_00104839:
            if ((bVar56) && ((ulong)(long)(int)num_literals[(long)psVar44 * 2] < uVar32 + position))
            {
              uVar32 = (long)(int)num_literals[(long)psVar44 * 2] - position;
            }
            if (3 < uVar32) {
              iVar19 = 0x1f;
              if ((uint)uVar42 != 0) {
                for (; (uint)uVar42 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                }
              }
              uVar23 = (ulong)(iVar19 * -0x1e + 0x780) + uVar32 * 0x87;
              if (local_150 < uVar23) {
                uVar48 = uVar32;
                local_150 = uVar23;
                local_110 = uVar42;
                local_100 = uVar32;
              }
            }
          }
        }
      } while (uVar36 < uVar47);
    }
    *(int *)(lVar43 + (ulong)(uVar35 & uVar6) * 4) = (int)position;
    *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar18 * 2) = uVar6 + 1;
    if (local_150 != 0x7e4) {
      iVar19 = 0;
      bVar56 = true;
      goto LAB_00104d9d;
    }
    if (!bVar15) {
      if (bVar56) {
        uVar36 = (ulong)(int)num_literals[(long)psVar44 * 2];
        goto LAB_00104bf6;
      }
      goto LAB_00104cfb;
    }
    sVar13 = (params->dist).max_distance;
    uVar30 = *(ulong *)(sVar13 + 8);
    local_168 = *(ulong *)(sVar13 + 0x10);
    bVar15 = true;
    if (uVar30 >> 7 <= local_168) {
      uVar40 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      lVar43 = *(long *)(literal_context_lut + 0x78);
      iVar19 = 0;
      local_150 = 0x7e4;
      bVar56 = true;
LAB_001049ca:
      uVar30 = uVar30 + 1;
      *(ulong *)(sVar13 + 8) = uVar30;
      bVar27 = *(byte *)(lVar43 + uVar40);
      uVar36 = (ulong)bVar27;
      if ((uVar36 != 0) && (uVar36 <= uVar52)) {
        uVar48 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar40 * 2);
        lVar24 = *(long *)(literal_context_lut + 0x58);
        pcVar33 = (char *)(uVar48 * uVar36 + *(long *)(lVar24 + 0xa8) +
                          (ulong)*(uint *)(lVar24 + 0x20 + uVar36 * 4));
        if (7 < bVar27) {
          uVar47 = (ulong)(bVar27 & 0xfffffff8);
          lVar54 = 0;
          uVar50 = 0;
LAB_00104a27:
          if (*(ulong *)(pcVar33 + uVar50 * 8) == *(ulong *)(piVar2 + uVar50 * 2))
          goto code_r0x00104a39;
          uVar50 = *(ulong *)(piVar2 + uVar50 * 2) ^ *(ulong *)(pcVar33 + uVar50 * 8);
          uVar47 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
            }
          }
          uVar50 = (uVar47 >> 3 & 0x1fffffff) - lVar54;
          goto LAB_00104a76;
        }
        uVar47 = 0;
        goto LAB_00104b71;
      }
      goto LAB_00104ae5;
    }
    goto LAB_001056ea;
  }
  uVar36 = (ulong)(int)num_literals[(long)psVar44 * 2];
  if (uVar36 < position) {
    psVar21 = num_literals + (long)psVar44 * 2;
    do {
      psVar44 = (size_t *)((long)psVar44 + 1);
      if (back_refs_position == psVar44) {
        *(size_t **)backward_references = psVar44;
        bVar56 = false;
        psVar44 = back_refs_position;
        goto LAB_00104495;
      }
      uVar36 = (ulong)(int)psVar21[2];
      psVar21 = psVar21 + 2;
    } while (uVar36 < position);
    *(size_t **)backward_references = psVar44;
    bVar56 = psVar44 < back_refs_position;
  }
  else {
    psVar21 = num_literals + (long)psVar44 * 2;
    bVar56 = true;
  }
  if (position != uVar36) {
LAB_00104495:
    bVar15 = false;
    goto LAB_00104497;
  }
  uVar18 = (uint)psVar21[1];
  local_110 = (ulong)(int)uVar18;
  if ((position - local_110 < position) && (uVar18 <= *(uint *)((long)psVar21 + 0xc))) {
    uVar30 = position - local_110 & ringbuffer_mask;
    if (7 < uVar52) {
      uVar22 = uVar52 & 0xfffffffffffffff8;
      puVar41 = ringbuffer + uVar22 + uVar40;
      lVar43 = 0;
      uVar36 = 0;
LAB_0010443e:
      uVar48 = *(ulong *)(ringbuffer + uVar40 + uVar36 * 8);
      if (uVar48 == *(ulong *)(ringbuffer + uVar36 * 8 + uVar30)) goto code_r0x0010444f;
      uVar48 = *(ulong *)(ringbuffer + uVar36 * 8 + uVar30) ^ uVar48;
      uVar30 = 0;
      if (uVar48 != 0) {
        for (; (uVar48 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
        }
      }
      uVar40 = (uVar30 >> 3 & 0x1fffffff) - lVar43;
      goto LAB_00104d5b;
    }
    uVar22 = 0;
    puVar41 = ringbuffer + uVar40;
LAB_00105e7a:
    uVar36 = uVar52 & 7;
    uVar40 = uVar22;
    if (uVar36 != 0) {
      uVar48 = uVar22 | uVar36;
      do {
        uVar40 = uVar22;
        if (ringbuffer[uVar22 + uVar30] != *puVar41) break;
        puVar41 = puVar41 + 1;
        uVar22 = uVar22 + 1;
        uVar36 = uVar36 - 1;
        uVar40 = uVar48;
      } while (uVar36 != 0);
    }
LAB_00104d5b:
    local_100 = (ulong)*(int *)((long)num_literals + (long)psVar44 * 0x10 + 4);
    if (uVar40 < local_100) {
      local_100 = uVar40;
    }
    iVar19 = 0x1f;
    if (uVar18 != 0) {
      for (; uVar18 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    local_150 = (ulong)(iVar19 * -0x1e + 0x780) + local_100 * 0x87;
    bVar15 = false;
    bVar56 = false;
    iVar19 = 0;
    goto LAB_00104d9d;
  }
LAB_00104bf6:
  if (position == uVar36) {
    uVar18 = (uint)num_literals[(long)psVar44 * 2 + 1];
    local_110 = (ulong)(int)uVar18;
    if (*(int *)((long)num_literals + (long)psVar44 * 0x10 + 0xc) < (int)uVar18) {
      uVar35 = *(uint *)((long)num_literals + (long)psVar44 * 0x10 + 4);
      uVar22 = (ulong)uVar35;
      if (uVar35 - 4 < 0x15 && (int)uVar18 < 0x7ffffffd) {
        uVar39 = ~(uint)uVar30 + uVar18;
        lVar43 = *(long *)(literal_context_lut + 0x58);
        iVar19 = (int)uVar39 >> (*(byte *)(lVar43 + uVar22) & 0x1f);
        if (iVar19 < *(int *)(literal_context_lut + 0x60)) {
          uVar10 = *(uint *)(lVar43 + 0x20 + uVar22 * 4);
          uVar7 = kBitMask[*(byte *)(lVar43 + uVar22)];
          lVar43 = *(long *)(lVar43 + 0xa8);
          uVar25 = BrotliGetTransforms();
          pvVar26 = malloc(uVar22 * 10);
          iVar19 = BrotliTransformDictionaryWord
                             (pvVar26,(ulong)uVar10 + lVar43 +
                                      (long)(int)((uVar39 & uVar7) * uVar35),uVar35,uVar25,iVar19);
          local_100 = (ulong)iVar19;
          iVar17 = bcmp(ringbuffer + uVar40,pvVar26,local_100);
          auVar57 = _DAT_0013b100;
          if (iVar17 == 0) {
            iVar17 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> iVar17 == 0; iVar17 = iVar17 + -1) {
              }
            }
            local_150 = (ulong)(iVar17 * -0x1e + 0x780) + local_100 * 0x87;
            iVar19 = uVar35 - iVar19;
            bVar15 = false;
            bVar56 = false;
            goto LAB_00104d9d;
          }
        }
      }
    }
  }
LAB_00104cfb:
  uVar45 = uVar45 + 1;
  uVar52 = position + 1;
  goto LAB_00105c51;
code_r0x00104599:
  uVar32 = uVar32 + 1;
  lVar24 = lVar24 + -8;
  puVar37 = puVar41 + (uVar52 & 0xfffffffffffffff8);
  uVar49 = uVar52 & 0xfffffffffffffff8;
  if (uVar52 >> 3 == uVar32) goto LAB_00104688;
  goto LAB_00104587;
code_r0x001047f7:
  uVar32 = uVar32 + 1;
  lVar24 = lVar24 + -8;
  piVar38 = (int *)(ringbuffer + (uVar52 & 0xfffffffffffffff8) + uVar40);
  uVar49 = uVar52 & 0xfffffffffffffff8;
  if (uVar52 >> 3 == uVar32) goto LAB_001048b3;
  goto LAB_001047e5;
code_r0x00104a39:
  uVar50 = uVar50 + 1;
  lVar54 = lVar54 + -8;
  if (bVar27 >> 3 == uVar50) goto code_r0x00104a45;
  goto LAB_00104a27;
code_r0x00104a45:
  pcVar33 = pcVar33 + -lVar54;
LAB_00104b71:
  uVar42 = uVar36 & 7;
  uVar50 = uVar47;
  if ((bVar27 & 7) != 0) {
    uVar23 = uVar47 | uVar42;
    do {
      uVar50 = uVar47;
      if (*(char *)((long)piVar2 + uVar47) != *pcVar33) break;
      pcVar33 = pcVar33 + 1;
      uVar47 = uVar47 + 1;
      uVar42 = uVar42 - 1;
      uVar50 = uVar23;
    } while (uVar42 != 0);
  }
LAB_00104a76:
  if (((uVar50 != 0) && (uVar36 < *(uint *)(literal_context_lut + 100) + uVar50)) &&
     (uVar36 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar36 - uVar50) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar36 - uVar50) * 4 << (*(byte *)(lVar24 + uVar36) & 0x3f)) +
               uVar48 + local_c8 + 1, uVar36 <= uVar22)) {
    iVar17 = 0x1f;
    if ((uint)uVar36 != 0) {
      for (; (uint)uVar36 >> iVar17 == 0; iVar17 = iVar17 + -1) {
      }
    }
    uVar48 = (uVar50 * 0x87 - (ulong)(uint)(iVar17 * 0x1e)) + 0x780;
    if (local_150 <= uVar48) {
      iVar19 = (uint)bVar27 - (int)uVar50;
      local_168 = local_168 + 1;
      *(ulong *)(sVar13 + 0x10) = local_168;
      local_150 = uVar48;
      local_110 = uVar36;
      local_100 = uVar50;
    }
  }
LAB_00104ae5:
  uVar40 = uVar40 + 1;
  bVar15 = !bVar56;
  bVar56 = false;
  if (bVar15) goto LAB_00104d19;
  goto LAB_001049ca;
LAB_00104d19:
  bVar15 = true;
  bVar56 = true;
LAB_00104d9d:
  if (local_150 < 0x7e5) {
LAB_001056ea:
    uVar45 = uVar45 + 1;
    uVar52 = position + 1;
    if (bVar15 && local_f8 < uVar52) {
      if ((uint)((int)lVar29 * 4) + local_f8 < uVar52) {
        uVar30 = position + 0x11;
        if (uVar1 - 4 <= position + 0x11) {
          uVar30 = uVar1 - 4;
        }
        if (uVar52 < uVar30) {
          uVar8 = (params->dist).distance_postfix_bits;
          uVar18 = (params->dist).num_direct_distance_codes;
          pBVar12 = (params->dictionary).words;
          uVar9 = (params->dist).alphabet_size_max;
          lVar43 = *(long *)&(params->dictionary).num_transforms;
          do {
            uVar35 = (uint)(*(int *)(ringbuffer + (uVar52 & ringbuffer_mask)) * 0x1e35a7bd) >>
                     ((byte)uVar8 & 0x1f);
            uVar6 = *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar35 * 2);
            *(int *)(lVar43 + (ulong)(uVar18 & uVar6) * 4 +
                    (ulong)(uVar35 << ((byte)uVar9 & 0x1f)) * 4) = (int)uVar52;
            *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar35 * 2) = uVar6 + 1;
            uVar45 = uVar45 + 4;
            uVar52 = uVar52 + 4;
          } while (uVar52 < uVar30);
        }
      }
      else {
        uVar30 = position + 9;
        if (uVar4 <= position + 9) {
          uVar30 = uVar4;
        }
        if (uVar52 < uVar30) {
          uVar8 = (params->dist).distance_postfix_bits;
          uVar18 = (params->dist).num_direct_distance_codes;
          pBVar12 = (params->dictionary).words;
          uVar9 = (params->dist).alphabet_size_max;
          lVar43 = *(long *)&(params->dictionary).num_transforms;
          do {
            uVar35 = (uint)(*(int *)(ringbuffer + (uVar52 & ringbuffer_mask)) * 0x1e35a7bd) >>
                     ((byte)uVar8 & 0x1f);
            uVar6 = *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar35 * 2);
            *(int *)(lVar43 + (ulong)(uVar18 & uVar6) * 4 +
                    (ulong)(uVar35 << ((byte)uVar9 & 0x1f)) * 4) = (int)uVar52;
            *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar35 * 2) = uVar6 + 1;
            uVar45 = uVar45 + 2;
            uVar52 = uVar52 + 2;
          } while (uVar52 < uVar30);
        }
      }
    }
    goto LAB_00105c51;
  }
  local_168 = local_100;
  if (bVar56) {
    pBVar12 = (params->dictionary).words;
    lVar43 = *(long *)&(params->dictionary).num_transforms;
    uVar30 = uVar45 + 4;
    uVar36 = (lVar3 + num_bytes) - position;
    iVar17 = 0;
    uVar22 = position;
    uVar40 = uVar45;
    iVar20 = iVar19;
    do {
      uVar48 = uVar36 >> 3;
      uVar52 = uVar52 - 1;
      uVar45 = local_100 - 1;
      if (uVar52 <= local_100 - 1) {
        uVar45 = uVar52;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar45 = 0;
      }
      position = uVar22 + 1;
      uVar47 = uVar5;
      if (position < uVar5) {
        uVar47 = position;
      }
      local_c8 = lVar11 + uVar22 + 1;
      if (uVar5 <= local_c8) {
        local_c8 = uVar5;
      }
      uVar50 = *(ulong *)(literal_context_lut + 0x50);
      uVar42 = position & ringbuffer_mask;
      psVar44 = *(size_t **)backward_references;
      bVar56 = true;
      if (psVar44 < back_refs_position) {
        uVar23 = (ulong)(int)num_literals[(long)psVar44 * 2];
        if (uVar23 < position) {
          psVar21 = num_literals + (long)psVar44 * 2;
          do {
            psVar44 = (size_t *)((long)psVar44 + 1);
            if (back_refs_position == psVar44) {
              *(size_t **)backward_references = psVar44;
              psVar44 = back_refs_position;
              goto LAB_00104f5a;
            }
            uVar23 = (ulong)(int)psVar21[2];
            psVar21 = psVar21 + 2;
          } while (uVar23 < position);
          *(size_t **)backward_references = psVar44;
          bVar56 = back_refs_position <= psVar44;
        }
        else {
          psVar21 = num_literals + (long)psVar44 * 2;
          bVar56 = false;
        }
        if (position != uVar23 || bVar15) goto LAB_00104f5a;
        uVar18 = (uint)psVar21[1];
        uVar45 = position - (long)(int)uVar18;
        if ((uVar45 < position) && (uVar18 <= *(uint *)((long)psVar21 + 0xc))) {
          uVar45 = uVar45 & ringbuffer_mask;
          puVar41 = ringbuffer + uVar42;
          if (uVar52 < 8) {
            uVar30 = 0;
            goto LAB_00105eb3;
          }
          lVar43 = 0;
          uVar30 = 0;
          goto LAB_00105dfe;
        }
        local_f0 = 0;
        local_168 = 0;
LAB_0010560a:
        if ((!bVar56) && (position == (long)(int)num_literals[(long)psVar44 * 2])) {
          iVar14 = (int)num_literals[(long)psVar44 * 2 + 1];
          if (*(int *)((long)num_literals + (long)psVar44 * 0x10 + 0xc) < iVar14) {
            uVar18 = *(uint *)((long)num_literals + (long)psVar44 * 0x10 + 4);
            uVar45 = (ulong)uVar18;
            iVar19 = 0;
            local_110 = local_f0;
            if (uVar18 - 4 < 0x15 && iVar14 < 0x7ffffffd) {
              uVar35 = ~(uint)uVar47 + iVar14;
              lVar43 = *(long *)(literal_context_lut + 0x58);
              iVar17 = (int)uVar35 >> (*(byte *)(lVar43 + uVar45) & 0x1f);
              if (iVar17 < *(int *)(literal_context_lut + 0x60)) {
                uVar39 = *(uint *)(lVar43 + 0x20 + uVar45 * 4);
                uVar10 = kBitMask[*(byte *)(lVar43 + uVar45)];
                lVar43 = *(long *)(lVar43 + 0xa8);
                uVar25 = BrotliGetTransforms();
                pvVar26 = malloc(uVar45 * 10);
                iVar17 = BrotliTransformDictionaryWord
                                   (pvVar26,(ulong)uVar39 + lVar43 +
                                            (long)(int)((uVar35 & uVar10) * uVar18),uVar18,uVar25,
                                    iVar17);
                iVar20 = bcmp(ringbuffer + uVar42,pvVar26,(long)iVar17);
                auVar57 = _DAT_0013b100;
                if (iVar20 == 0) {
                  iVar19 = uVar18 - iVar17;
                  local_168 = (long)iVar17;
                  local_110 = (long)iVar14;
                }
              }
            }
            goto LAB_00105e58;
          }
        }
LAB_0010563b:
        iVar19 = 0;
        local_170 = 0x7e4;
      }
      else {
LAB_00104f5a:
        uVar23 = (ulong)(int)(params->dist).alphabet_size_limit;
        if (uVar23 != 0) {
          puVar41 = ringbuffer + uVar42;
          uVar32 = (ulong)((uint)uVar52 & 7);
          local_170 = 0x7e4;
          uVar49 = 0;
          local_168 = 0;
          local_f0 = 0;
LAB_00104fc9:
          uVar53 = (ulong)*(int *)((long)&(hasher->common).extra + uVar49 * 4);
          if (((uVar53 <= uVar47) && (position - uVar53 < position)) &&
             (uVar45 + uVar42 <= ringbuffer_mask)) {
            uVar31 = position - uVar53 & ringbuffer_mask;
            if ((ringbuffer_mask < uVar31 + uVar45) ||
               (ringbuffer[uVar45 + uVar42] != ringbuffer[uVar31 + uVar45])) goto LAB_001050ea;
            uVar55 = uVar32;
            if (7 < uVar52) {
              lVar24 = 0;
              uVar51 = 0;
LAB_0010502d:
              if (*(ulong *)(puVar41 + uVar51 * 8) == *(ulong *)(ringbuffer + uVar51 * 8 + uVar31))
              goto code_r0x0010503f;
              uVar55 = *(ulong *)(ringbuffer + uVar51 * 8 + uVar31) ^
                       *(ulong *)(puVar41 + uVar51 * 8);
              uVar31 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar51 = (uVar31 >> 3 & 0x1fffffff) - lVar24;
              goto LAB_00105071;
            }
            uVar51 = 0;
            puVar37 = puVar41;
            goto joined_r0x00105108;
          }
          goto LAB_001050ea;
        }
        local_170 = 0x7e4;
        local_f0 = 0;
        local_168 = 0;
LAB_0010514b:
        uVar18 = (uint)(*(int *)(ringbuffer + uVar42) * 0x1e35a7bd) >>
                 ((byte)(params->dist).distance_postfix_bits & 0x1f);
        piVar2 = (int *)(ringbuffer + uVar42);
        lVar24 = lVar43 + (ulong)(uVar18 << ((byte)(params->dist).alphabet_size_max & 0x1f)) * 4;
        uVar6 = *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar18 * 2);
        uVar32 = (ulong)uVar6;
        piVar38 = &(params->hasher).num_last_distances_to_check;
        uVar23 = 0;
        if (*(ulong *)piVar38 <= uVar32) {
          uVar23 = uVar32 - *(long *)piVar38;
        }
        uVar35 = (params->dist).num_direct_distance_codes;
        if (uVar23 < uVar32) {
          uVar49 = (ulong)((uint)uVar52 & 7);
LAB_001051f2:
          uVar32 = uVar32 - 1;
          uVar39 = *(uint *)(lVar24 + (ulong)((uint)uVar32 & uVar35) * 4);
          uVar53 = position - uVar39;
          if (uVar53 <= uVar47) {
            if (uVar45 + uVar42 <= ringbuffer_mask) {
              uVar31 = (ulong)(uVar39 & (uint)ringbuffer_mask);
              if ((ringbuffer_mask < uVar31 + uVar45) ||
                 (ringbuffer[uVar45 + uVar42] != ringbuffer[uVar31 + uVar45])) goto LAB_001052fa;
              uVar55 = uVar49;
              if (7 < uVar52) {
                lVar54 = 0;
                uVar51 = 0;
LAB_00105250:
                if (*(ulong *)(piVar2 + uVar51 * 2) == *(ulong *)(ringbuffer + uVar51 * 8 + uVar31))
                goto code_r0x00105262;
                uVar55 = *(ulong *)(ringbuffer + uVar51 * 8 + uVar31) ^
                         *(ulong *)(piVar2 + uVar51 * 2);
                uVar31 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar51 = (uVar31 >> 3 & 0x1fffffff) - lVar54;
                goto LAB_00105293;
              }
              uVar51 = 0;
              piVar38 = piVar2;
              goto joined_r0x00105317;
            }
            goto LAB_001052fa;
          }
        }
LAB_0010533a:
        *(int *)(lVar24 + (ulong)(uVar35 & uVar6) * 4) = (int)position;
        *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar18 * 2) = uVar6 + 1;
        iVar19 = 0;
        if (local_170 == 0x7e4) {
          if (!bVar15) goto LAB_0010560a;
          sVar13 = (params->dist).max_distance;
          uVar45 = *(ulong *)(sVar13 + 8);
          local_b0 = *(ulong *)(sVar13 + 0x10);
          if (uVar45 >> 7 <= local_b0) {
            uVar48 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            lVar24 = *(long *)(literal_context_lut + 0x78);
            iVar19 = 0;
            local_170 = 0x7e4;
            bVar56 = true;
LAB_0010540c:
            uVar45 = uVar45 + 1;
            *(ulong *)(sVar13 + 8) = uVar45;
            bVar27 = *(byte *)(lVar24 + uVar48);
            uVar47 = (ulong)bVar27;
            if ((uVar47 != 0) && (uVar47 <= uVar52)) {
              uVar42 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar48 * 2);
              lVar54 = *(long *)(literal_context_lut + 0x58);
              pcVar33 = (char *)(uVar42 * uVar47 + *(long *)(lVar54 + 0xa8) +
                                (ulong)*(uint *)(lVar54 + 0x20 + uVar47 * 4));
              if (7 < bVar27) {
                uVar23 = (ulong)(bVar27 & 0xfffffff8);
                lVar46 = 0;
                uVar32 = 0;
LAB_00105494:
                if (*(ulong *)(pcVar33 + uVar32 * 8) == *(ulong *)(piVar2 + uVar32 * 2))
                goto code_r0x001054a6;
                uVar32 = *(ulong *)(piVar2 + uVar32 * 2) ^ *(ulong *)(pcVar33 + uVar32 * 8);
                uVar23 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                uVar32 = (uVar23 >> 3 & 0x1fffffff) - lVar46;
                goto LAB_001054e7;
              }
              uVar23 = 0;
              goto LAB_001055b3;
            }
            goto LAB_0010542f;
          }
          goto LAB_0010563b;
        }
      }
LAB_00105641:
      if (local_170 < local_150 + 0xaf) {
        position = uVar22;
        local_168 = local_100;
        uVar45 = uVar40;
        iVar19 = iVar20;
        local_c8 = uVar22 + lVar11;
        if (uVar5 <= uVar22 + lVar11) {
          local_c8 = uVar5;
        }
        break;
      }
      local_110 = local_f0;
      uVar45 = uVar30;
      if (iVar17 == 3) break;
      uVar40 = uVar40 + 1;
      iVar17 = iVar17 + 1;
      uVar48 = uVar22 + 5;
      uVar36 = uVar36 - 1;
      local_100 = local_168;
      uVar22 = position;
      uVar45 = uVar40;
      local_150 = local_170;
      iVar20 = iVar19;
    } while (uVar48 < uVar1);
  }
LAB_001058b0:
  if (local_c8 < local_110) {
LAB_001058ce:
    uVar30 = local_110 + 0xf;
LAB_001058d2:
    if ((local_110 <= local_c8) && (uVar30 != 0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      pvVar26 = (hasher->common).extra;
      *(void **)((long)&(hasher->common).extra + 4) = pvVar26;
      iVar17 = (int)local_110;
      *(int *)&(hasher->common).extra = iVar17;
      uVar18 = (params->dist).alphabet_size_limit;
      if (4 < (int)uVar18) {
        *(int *)&(hasher->common).dict_num_matches = iVar17 + auVar57._0_4_;
        *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar17 + auVar57._4_4_;
        (hasher->common).params.type = iVar17 + auVar57._8_4_;
        (hasher->common).params.bucket_bits = iVar17 + auVar57._12_4_;
        (hasher->common).params.block_bits = iVar17 + -3;
        (hasher->common).params.hash_len = iVar17 + 3;
        if (10 < uVar18) {
          iVar17 = (int)pvVar26;
          (hasher->common).params.num_last_distances_to_check = iVar17 + auVar57._0_4_;
          (hasher->common).is_prepared_ = iVar17 + auVar57._4_4_;
          *(int *)&hasher->privat = iVar17 + auVar57._8_4_;
          *(int *)((long)&hasher->privat + 4) = iVar17 + auVar57._12_4_;
          (hasher->privat)._H5.block_size_ = CONCAT44(iVar17 + 3,iVar17 + -3);
        }
      }
    }
  }
  else {
    uVar52 = (ulong)*(int *)&(hasher->common).extra;
    if (local_110 != uVar52) {
      uVar22 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      uVar30 = 1;
      if (local_110 != uVar22) {
        uVar52 = (local_110 + 3) - uVar52;
        if (uVar52 < 7) {
          bVar27 = (byte)((int)uVar52 << 2);
          uVar18 = 0x9750468;
        }
        else {
          uVar22 = (local_110 + 3) - uVar22;
          if (6 < uVar22) {
            uVar30 = 2;
            if ((local_110 != (long)(int)(hasher->common).dict_num_lookups) &&
               (uVar30 = 3,
               local_110 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
            goto LAB_001058ce;
            goto LAB_001058d2;
          }
          bVar27 = (byte)((int)uVar22 << 2);
          uVar18 = 0xfdb1ace;
        }
        uVar30 = (ulong)(uVar18 >> (bVar27 & 0x1f) & 0xf);
      }
      goto LAB_001058d2;
    }
    uVar30 = 0;
  }
  uVar18 = (uint)uVar45;
  *(uint *)local_c0 = uVar18;
  *(uint *)((long)local_c0 + 4) = iVar19 << 0x19 | (uint)local_168;
  uVar52 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar35 = 0;
  if (uVar52 <= uVar30) {
    bVar27 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar22 = ((4L << (bVar27 & 0x3f)) + (uVar30 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
    uVar35 = 0x1f;
    uVar39 = (uint)uVar22;
    if (uVar39 != 0) {
      for (; uVar39 >> uVar35 == 0; uVar35 = uVar35 - 1) {
      }
    }
    uVar35 = (uVar35 ^ 0xffffffe0) + 0x1f;
    uVar40 = (ulong)((uVar22 >> ((ulong)uVar35 & 0x3f) & 1) != 0);
    lVar43 = (ulong)uVar35 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uVar30 = (~(-1 << (bVar27 & 0x1f)) & uVar39) + uVar52 +
             (uVar40 + lVar43 * 2 + 0xfffe << (bVar27 & 0x3f)) | lVar43 * 0x400;
    uVar35 = (uint)(uVar22 - (uVar40 + 2 << ((byte)uVar35 & 0x3f)) >> (bVar27 & 0x3f));
  }
  *(short *)((long)local_c0 + 0xe) = (short)uVar30;
  *(uint *)(local_c0 + 1) = uVar35;
  if (5 < uVar45) {
    if (uVar45 < 0x82) {
      uVar18 = 0x1f;
      uVar35 = (uint)(uVar45 - 2);
      if (uVar35 != 0) {
        for (; uVar35 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar18 = (int)(uVar45 - 2 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar18 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar45 < 0x842) {
      uVar35 = 0x1f;
      if (uVar18 - 0x42 != 0) {
        for (; uVar18 - 0x42 >> uVar35 == 0; uVar35 = uVar35 - 1) {
        }
      }
      uVar18 = (uVar35 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar18 = 0x15;
      if (0x1841 < uVar45) {
        uVar18 = (uint)(ushort)(0x17 - (uVar45 < 0x5842));
      }
    }
  }
  uVar35 = iVar19 + (uint)local_168;
  if (uVar35 < 10) {
    uVar39 = uVar35 - 2;
  }
  else if (uVar35 < 0x86) {
    uVar35 = uVar35 - 6;
    uVar39 = 0x1f;
    if (uVar35 != 0) {
      for (; uVar35 >> uVar39 == 0; uVar39 = uVar39 - 1) {
      }
    }
    uVar39 = (uVar35 >> ((char)(uVar39 ^ 0xffffffe0) + 0x1fU & 0x1f)) + 0x42 +
             (uVar39 ^ 0xffffffe0) * 2;
  }
  else {
    uVar39 = 0x17;
    if (uVar35 < 0x846) {
      uVar39 = 0x1f;
      if (uVar35 - 0x46 != 0) {
        for (; uVar35 - 0x46 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar39 = (uVar39 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar39;
  uVar34 = (uVar6 & 7) + ((ushort)uVar18 & 7) * 8;
  if ((((uVar30 & 0x3ff) == 0) && ((ushort)uVar18 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      uVar34 = uVar34 | 0x40;
    }
  }
  else {
    iVar19 = ((uVar18 & 0xffff) >> 3) * 3 + ((uVar39 & 0xffff) >> 3);
    uVar34 = uVar34 + ((ushort)(0x520d40 >> ((char)iVar19 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar19 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_c0 + 0xc) = uVar34;
  *num_commands = *num_commands + uVar45;
  uVar52 = position + local_168;
  uVar45 = sVar28;
  if (uVar52 < sVar28) {
    uVar45 = uVar52;
  }
  uVar30 = position + 2;
  if (local_110 < local_168 >> 2) {
    uVar22 = uVar52 + local_110 * -4;
    if (uVar22 < uVar30) {
      uVar22 = uVar30;
    }
    uVar30 = uVar22;
    if (uVar45 < uVar22) {
      uVar30 = uVar45;
    }
  }
  local_f8 = lVar29 + local_168 * 2 + position;
  local_c0 = local_c0 + 2;
  if (uVar30 < uVar45) {
    uVar8 = (params->dist).distance_postfix_bits;
    uVar18 = (params->dist).num_direct_distance_codes;
    pBVar12 = (params->dictionary).words;
    uVar9 = (params->dist).alphabet_size_max;
    lVar43 = *(long *)&(params->dictionary).num_transforms;
    do {
      uVar35 = (uint)(*(int *)(ringbuffer + (uVar30 & ringbuffer_mask)) * 0x1e35a7bd) >>
               ((byte)uVar8 & 0x1f);
      uVar6 = *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar35 * 2);
      *(int *)(lVar43 + (ulong)(uVar18 & uVar6) * 4 + (ulong)(uVar35 << ((byte)uVar9 & 0x1f)) * 4) =
           (int)uVar30;
      *(ushort *)(pBVar12->size_bits_by_length + (ulong)uVar35 * 2) = uVar6 + 1;
      uVar30 = uVar30 + 1;
    } while (uVar45 != uVar30);
  }
  uVar45 = 0;
LAB_00105c51:
  position = uVar52;
  if (uVar1 <= position + 4) goto LAB_00105ee6;
  goto LAB_0010430d;
code_r0x0010444f:
  uVar36 = uVar36 + 1;
  lVar43 = lVar43 + -8;
  if (uVar52 >> 3 == uVar36) goto LAB_00105e7a;
  goto LAB_0010443e;
code_r0x0010503f:
  uVar51 = uVar51 + 1;
  lVar24 = lVar24 + -8;
  if (uVar48 == uVar51) goto code_r0x00105050;
  goto LAB_0010502d;
code_r0x00105050:
  uVar51 = -lVar24;
  puVar37 = puVar41 + -lVar24;
joined_r0x00105108:
  for (; (uVar55 != 0 && (ringbuffer[uVar51 + uVar31] == *puVar37)); uVar51 = uVar51 + 1) {
    uVar55 = uVar55 - 1;
    puVar37 = puVar37 + 1;
  }
LAB_00105071:
  if ((!bVar15 && !bVar56) &&
     ((ulong)(long)(int)num_literals[(long)psVar44 * 2] < uVar51 + position)) {
    uVar51 = (long)(int)num_literals[(long)psVar44 * 2] - position;
  }
  if (((2 < uVar51) || ((uVar49 < 2 && (uVar51 == 2)))) &&
     (uVar31 = uVar51 * 0x87 + 0x78f, local_170 < uVar31)) {
    if (uVar49 != 0) {
      uVar31 = uVar31 - ((0x1ca10U >> ((byte)uVar49 & 0xe) & 0xe) + 0x27);
    }
    if (local_170 < uVar31) {
      uVar45 = uVar51;
      local_170 = uVar31;
      local_168 = uVar51;
      local_f0 = uVar53;
    }
  }
LAB_001050ea:
  uVar49 = uVar49 + 1;
  if (uVar49 == uVar23) goto LAB_0010514b;
  goto LAB_00104fc9;
code_r0x00105262:
  uVar51 = uVar51 + 1;
  lVar54 = lVar54 + -8;
  if (uVar48 == uVar51) goto code_r0x00105273;
  goto LAB_00105250;
code_r0x00105273:
  uVar51 = -lVar54;
  piVar38 = (int *)((long)piVar2 - lVar54);
joined_r0x00105317:
  for (; (uVar55 != 0 && (ringbuffer[uVar51 + uVar31] == (uint8_t)*piVar38)); uVar51 = uVar51 + 1) {
    uVar55 = uVar55 - 1;
    piVar38 = (int *)((long)piVar38 + 1);
  }
LAB_00105293:
  if ((!bVar15 && !bVar56) &&
     ((ulong)(long)(int)num_literals[(long)psVar44 * 2] < uVar51 + position)) {
    uVar51 = (long)(int)num_literals[(long)psVar44 * 2] - position;
  }
  if (3 < uVar51) {
    iVar19 = 0x1f;
    if ((uint)uVar53 != 0) {
      for (; (uint)uVar53 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    uVar31 = (ulong)(iVar19 * -0x1e + 0x780) + uVar51 * 0x87;
    if (local_170 < uVar31) {
      uVar45 = uVar51;
      local_170 = uVar31;
      local_168 = uVar51;
      local_f0 = uVar53;
    }
  }
LAB_001052fa:
  if (uVar32 <= uVar23) goto LAB_0010533a;
  goto LAB_001051f2;
code_r0x001054a6:
  uVar32 = uVar32 + 1;
  lVar46 = lVar46 + -8;
  if (bVar27 >> 3 == uVar32) goto code_r0x001054b2;
  goto LAB_00105494;
code_r0x001054b2:
  pcVar33 = pcVar33 + -lVar46;
LAB_001055b3:
  uVar49 = uVar47 & 7;
  uVar32 = uVar23;
  if ((bVar27 & 7) != 0) {
    uVar53 = uVar23 | uVar49;
    do {
      uVar32 = uVar23;
      if (*(char *)((long)piVar2 + uVar23) != *pcVar33) break;
      pcVar33 = pcVar33 + 1;
      uVar23 = uVar23 + 1;
      uVar49 = uVar49 - 1;
      uVar32 = uVar53;
    } while (uVar49 != 0);
  }
LAB_001054e7:
  if (((uVar32 != 0) && (uVar47 < *(uint *)(literal_context_lut + 100) + uVar32)) &&
     (uVar47 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar47 - uVar32) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar47 - uVar32) * 4 << (*(byte *)(lVar54 + uVar47) & 0x3f)) +
               uVar42 + local_c8 + 1, uVar47 <= uVar50)) {
    iVar14 = 0x1f;
    if ((uint)uVar47 != 0) {
      for (; (uint)uVar47 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar42 = (uVar32 * 0x87 - (ulong)(uint)(iVar14 * 0x1e)) + 0x780;
    if (local_170 <= uVar42) {
      iVar19 = (uint)bVar27 - (int)uVar32;
      local_b0 = local_b0 + 1;
      *(ulong *)(sVar13 + 0x10) = local_b0;
      local_170 = uVar42;
      local_168 = uVar32;
      local_f0 = uVar47;
    }
  }
LAB_0010542f:
  uVar48 = uVar48 + 1;
  bVar16 = !bVar56;
  bVar56 = false;
  if (bVar16) goto LAB_00105641;
  goto LAB_0010540c;
LAB_00105dfe:
  if (*(ulong *)(puVar41 + uVar30 * 8) == *(ulong *)(ringbuffer + uVar30 * 8 + uVar45))
  goto code_r0x00105e0c;
  uVar52 = *(ulong *)(ringbuffer + uVar30 * 8 + uVar45) ^ *(ulong *)(puVar41 + uVar30 * 8);
  uVar45 = 0;
  if (uVar52 != 0) {
    for (; (uVar52 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
    }
  }
  uVar30 = (uVar45 >> 3 & 0x1fffffff) - lVar43;
  goto LAB_00105e38;
code_r0x00105e0c:
  uVar30 = uVar30 + 1;
  lVar43 = lVar43 + -8;
  if (uVar48 == uVar30) goto code_r0x00105e1d;
  goto LAB_00105dfe;
code_r0x00105e1d:
  puVar41 = puVar41 + -lVar43;
  uVar30 = -lVar43;
LAB_00105eb3:
  uVar52 = uVar52 & 7;
  for (; (uVar52 != 0 && (ringbuffer[uVar30 + uVar45] == *puVar41)); uVar30 = uVar30 + 1) {
    puVar41 = puVar41 + 1;
    uVar52 = uVar52 - 1;
  }
LAB_00105e38:
  local_168 = (ulong)*(int *)((long)num_literals + (long)psVar44 * 0x10 + 4);
  if (uVar30 < local_168) {
    local_168 = uVar30;
  }
  iVar19 = 0;
  local_110 = (long)(int)uVar18;
LAB_00105e58:
  uVar45 = uVar40 + 1;
  goto LAB_001058b0;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}